

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty_needle_removal.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::EmptyNeedleRemovalRule::Apply
          (EmptyNeedleRemovalRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  Expression *expr;
  int iVar1;
  reference pvVar2;
  BoundFunctionExpression *pBVar3;
  ClientContext *context;
  string *psVar4;
  reference pvVar5;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_108;
  _func_int **local_100;
  LogicalType local_f8;
  Value prefix_value;
  Value local_a0;
  Value local_60;
  
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                     (&pvVar2->_M_data->super_BaseExpression);
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,2);
  expr = pvVar2->_M_data;
  iVar1 = (*(expr->super_BaseExpression)._vptr_BaseExpression[0xf])(expr);
  if ((char)iVar1 != '\0') {
    context = Rule::GetContext((Rule *)op);
    ExpressionExecutor::EvaluateScalar(&prefix_value,context,expr,false);
    if (prefix_value.is_null == true) {
      LogicalType::LogicalType(&local_f8,BOOLEAN);
      Value::Value(&local_60,&local_f8);
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_100,&local_60);
      (this->super_Rule)._vptr_Rule = local_100;
      local_100 = (_func_int **)0x0;
      Value::~Value(&local_60);
      LogicalType::~LogicalType(&local_f8);
    }
    else if ((prefix_value.type_.physical_type_ == VARCHAR) &&
            (psVar4 = StringValue::Get_abi_cxx11_(&prefix_value), psVar4->_M_string_length == 0)) {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(&pBVar3->children,0);
      local_108._M_head_impl =
           (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      Value::BOOLEAN(&local_a0,true);
      ExpressionRewriter::ConstantOrNull
                ((ExpressionRewriter *)this,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_108,&local_a0);
      Value::~Value(&local_a0);
      if (local_108._M_head_impl != (Expression *)0x0) {
        (*((local_108._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_108._M_head_impl = (Expression *)0x0;
    }
    else {
      (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
    }
    Value::~Value(&prefix_value);
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> EmptyNeedleRemovalRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                     bool &changes_made, bool is_root) {
	auto &root = bindings[0].get().Cast<BoundFunctionExpression>();
	D_ASSERT(root.children.size() == 2);
	auto &prefix_expr = bindings[2].get();

	// the constant_expr is a scalar expression that we have to fold
	if (!prefix_expr.IsFoldable()) {
		return nullptr;
	}
	D_ASSERT(root.return_type.id() == LogicalTypeId::BOOLEAN);

	auto prefix_value = ExpressionExecutor::EvaluateScalar(GetContext(), prefix_expr);

	if (prefix_value.IsNull()) {
		return make_uniq<BoundConstantExpression>(Value(LogicalType::BOOLEAN));
	}

	D_ASSERT(prefix_value.type() == prefix_expr.return_type);
	if (prefix_value.type().InternalType() != PhysicalType::VARCHAR) {
		return nullptr;
	}
	auto &needle_string = StringValue::Get(prefix_value);

	// PREFIX('xyz', '') is TRUE
	// PREFIX(NULL, '') is NULL
	// so rewrite PREFIX(x, '') to TRUE_OR_NULL(x)
	if (needle_string.empty()) {
		return ExpressionRewriter::ConstantOrNull(std::move(root.children[0]), Value::BOOLEAN(true));
	}
	return nullptr;
}